

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_panel_dfs.h
# Opt level: O3

void __thiscall
Eigen::internal::SparseLUImpl<double,int>::
dfs_kernel<Eigen::internal::panel_dfs_traits<Eigen::Matrix<int,_1,1,0,_1,1>>>
          (SparseLUImpl<double,int> *this,int jj,IndexVector *perm_r,int *nseg,
          IndexVector *panel_lsub,IndexVector *segrep,
          Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *repfnz_col,
          IndexVector *xprune,
          Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *marker,
          IndexVector *parent,IndexVector *xplore,GlobalLU_t *glu,int *nextl_col,int krow,
          panel_dfs_traits<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *traits)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  int *piVar18;
  Index *pIVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  char *__function;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  
  lVar26 = (long)krow;
  if ((lVar26 < 0) ||
     (lVar4 = *(long *)&(marker->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ).field_0x8, lVar4 <= lVar26)) goto LAB_001518e6;
  lVar5 = *(long *)&marker->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ;
  *(int *)(lVar5 + lVar26 * 4) = jj;
  lVar6 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar26 < lVar6) {
    piVar7 = (perm_r->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    iVar30 = piVar7[lVar26];
    lVar26 = (long)iVar30;
    if (lVar26 == -1) {
      lVar26 = (long)*nextl_col;
      *nextl_col = *nextl_col + 1;
      if ((-1 < lVar26) &&
         (lVar26 < (panel_lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows)) {
        (panel_lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [lVar26] = krow;
        return;
      }
    }
    else if ((-1 < iVar30) &&
            (lVar8 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows, lVar26 < lVar8)) {
      piVar9 = (glu->supno).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      lVar26 = (long)piVar9[lVar26];
      if ((-2 < lVar26) &&
         (lVar10 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows, lVar26 + 1 < lVar10)) {
        piVar11 = (glu->xsup).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        lVar26 = (long)piVar11[lVar26 + 1];
        if (0 < lVar26) {
          uVar29 = lVar26 - 1;
          lVar12 = *(long *)&(repfnz_col->
                             super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             ).field_0x8;
          if ((long)uVar29 < lVar12) {
            lVar13 = *(long *)&repfnz_col->
                               super_RefBase<Eigen::Ref<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ;
            iVar28 = *(int *)(lVar13 + -4 + lVar26 * 4);
            if (iVar28 != -1) {
              if (iVar28 <= iVar30) {
                return;
              }
              *(int *)(lVar13 + -4 + lVar26 * 4) = iVar30;
              return;
            }
            lVar14 = (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                     .m_rows;
            if ((long)uVar29 < lVar14) {
              piVar15 = (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              piVar15[lVar26 + -1] = -1;
              *(int *)(lVar13 + -4 + lVar26 * 4) = iVar30;
              lVar26 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows;
              if (((long)uVar29 < lVar26) &&
                 (lVar16 = (xprune->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                           m_storage.m_rows, (long)uVar29 < lVar16)) {
                piVar17 = (glu->xlsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
                piVar24 = piVar17 + uVar29;
                piVar18 = (xprune->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                pIVar19 = traits->m_marker;
                piVar20 = (segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                piVar21 = (xplore->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                do {
                  iVar30 = *piVar24;
                  iVar28 = piVar18[uVar29];
                  if (iVar30 < iVar28) {
                    piVar24 = (glu->lsub).
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                              m_data;
                    piVar22 = (xplore->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                              m_storage.m_data;
                    piVar23 = (panel_lsub->
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                              .m_data;
                    do {
                      if ((iVar30 < 0) ||
                         ((glu->lsub).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows <= (long)iVar30)) goto LAB_001518cf;
                      iVar2 = piVar24[iVar30];
                      lVar27 = (long)iVar2;
                      if ((lVar27 < 0) || (lVar4 <= lVar27)) goto LAB_001518e6;
                      iVar30 = iVar30 + 1;
                      if (*(int *)(lVar5 + lVar27 * 4) != jj) {
                        *(int *)(lVar5 + lVar27 * 4) = jj;
                        if (lVar6 <= lVar27) goto LAB_001518cf;
                        iVar3 = piVar7[lVar27];
                        lVar27 = (long)iVar3;
                        if (lVar27 == -1) {
                          lVar27 = (long)*nextl_col;
                          *nextl_col = *nextl_col + 1;
                          if ((lVar27 < 0) ||
                             ((panel_lsub->
                              super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                              .m_rows <= lVar27)) goto LAB_001518cf;
                          piVar23[lVar27] = iVar2;
                        }
                        else {
                          if ((((iVar3 < 0) || (lVar8 <= lVar27)) ||
                              (lVar27 = (long)piVar9[lVar27], lVar27 < -1)) ||
                             (lVar10 <= lVar27 + 1)) goto LAB_001518cf;
                          lVar27 = (long)piVar11[lVar27 + 1];
                          if ((lVar27 < 1) || (uVar1 = lVar27 - 1, lVar12 <= (long)uVar1))
                          goto LAB_001518e6;
                          iVar2 = *(int *)(lVar13 + -4 + lVar27 * 4);
                          if (iVar2 == -1) {
                            iVar28 = (int)uVar29;
                            if (((iVar28 < 0) ||
                                ((xplore->
                                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                                 m_storage.m_rows <= (long)iVar28)) ||
                               (piVar22[iVar28] = iVar30, lVar14 <= (long)uVar1)) goto LAB_001518cf;
                            piVar15[lVar27 + -1] = iVar28;
                            *(int *)(lVar13 + -4 + lVar27 * 4) = iVar3;
                            if ((lVar26 <= (long)uVar1) || (lVar16 <= (long)uVar1))
                            goto LAB_001518cf;
                            iVar30 = piVar17[lVar27 + -1];
                            iVar28 = piVar18[lVar27 + -1];
                            uVar29 = uVar1 & 0xffffffff;
                          }
                          else if (iVar3 < iVar2) {
                            *(int *)(lVar13 + -4 + lVar27 * 4) = iVar3;
                          }
                        }
                      }
                    } while (iVar30 < iVar28);
                  }
                  iVar30 = (int)uVar29;
                  lVar27 = (long)iVar30;
                  if (pIVar19[lVar27] < traits->m_jcol) {
                    pIVar19[lVar27] = jj;
                    lVar25 = (long)*nseg;
                    if ((lVar25 < 0) ||
                       ((segrep->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows <= lVar25)) break;
                    piVar20[lVar25] = iVar30;
                    *nseg = *nseg + 1;
                  }
                  if ((iVar30 < 0) || (lVar14 <= lVar27)) break;
                  uVar29 = (ulong)piVar15[lVar27];
                  if (uVar29 == 0xffffffffffffffff) {
                    return;
                  }
                  if (((piVar15[lVar27] < 0) ||
                      ((xplore->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows <= (long)uVar29)) || (lVar16 <= (long)uVar29)) break;
                  piVar24 = piVar21 + uVar29;
                } while( true );
              }
            }
            goto LAB_001518cf;
          }
        }
LAB_001518e6:
        __function = 
        "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<int, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<int, -1, 1>>, Level = 1]"
        ;
        goto LAB_001518fb;
      }
    }
  }
LAB_001518cf:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
  ;
LAB_001518fb:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                ,0x18a,__function);
}

Assistant:

void SparseLUImpl<Scalar,Index>::dfs_kernel(const Index jj, IndexVector& perm_r,
                   Index& nseg, IndexVector& panel_lsub, IndexVector& segrep,
                   Ref<IndexVector> repfnz_col, IndexVector& xprune, Ref<IndexVector> marker, IndexVector& parent,
                   IndexVector& xplore, GlobalLU_t& glu,
                   Index& nextl_col, Index krow, Traits& traits
                  )
{
  
  Index kmark = marker(krow);
      
  // For each unmarked krow of jj
  marker(krow) = jj; 
  Index kperm = perm_r(krow); 
  if (kperm == emptyIdxLU ) {
    // krow is in L : place it in structure of L(*, jj)
    panel_lsub(nextl_col++) = krow;  // krow is indexed into A
    
    traits.mem_expand(panel_lsub, nextl_col, kmark);
  }
  else 
  {
    // krow is in U : if its supernode-representative krep
    // has been explored, update repfnz(*)
    // krep = supernode representative of the current row
    Index krep = glu.xsup(glu.supno(kperm)+1) - 1; 
    // First nonzero element in the current column:
    Index myfnz = repfnz_col(krep); 
    
    if (myfnz != emptyIdxLU )
    {
      // Representative visited before
      if (myfnz > kperm ) repfnz_col(krep) = kperm; 
      
    }
    else 
    {
      // Otherwise, perform dfs starting at krep
      Index oldrep = emptyIdxLU; 
      parent(krep) = oldrep; 
      repfnz_col(krep) = kperm; 
      Index xdfs =  glu.xlsub(krep); 
      Index maxdfs = xprune(krep); 
      
      Index kpar;
      do 
      {
        // For each unmarked kchild of krep
        while (xdfs < maxdfs) 
        {
          Index kchild = glu.lsub(xdfs); 
          xdfs++; 
          Index chmark = marker(kchild); 
          
          if (chmark != jj ) 
          {
            marker(kchild) = jj; 
            Index chperm = perm_r(kchild); 
            
            if (chperm == emptyIdxLU) 
            {
              // case kchild is in L: place it in L(*, j)
              panel_lsub(nextl_col++) = kchild;
              traits.mem_expand(panel_lsub, nextl_col, chmark);
            }
            else
            {
              // case kchild is in U :
              // chrep = its supernode-rep. If its rep has been explored, 
              // update its repfnz(*)
              Index chrep = glu.xsup(glu.supno(chperm)+1) - 1; 
              myfnz = repfnz_col(chrep); 
              
              if (myfnz != emptyIdxLU) 
              { // Visited before 
                if (myfnz > chperm) 
                  repfnz_col(chrep) = chperm; 
              }
              else 
              { // Cont. dfs at snode-rep of kchild
                xplore(krep) = xdfs; 
                oldrep = krep; 
                krep = chrep; // Go deeper down G(L)
                parent(krep) = oldrep; 
                repfnz_col(krep) = chperm; 
                xdfs = glu.xlsub(krep); 
                maxdfs = xprune(krep); 
                
              } // end if myfnz != -1
            } // end if chperm == -1 
                
          } // end if chmark !=jj
        } // end while xdfs < maxdfs
        
        // krow has no more unexplored nbrs :
        //    Place snode-rep krep in postorder DFS, if this 
        //    segment is seen for the first time. (Note that 
        //    "repfnz(krep)" may change later.)
        //    Baktrack dfs to its parent
        if(traits.update_segrep(krep,jj))
        //if (marker1(krep) < jcol )
        {
          segrep(nseg) = krep; 
          ++nseg; 
          //marker1(krep) = jj; 
        }
        
        kpar = parent(krep); // Pop recursion, mimic recursion 
        if (kpar == emptyIdxLU) 
          break; // dfs done 
        krep = kpar; 
        xdfs = xplore(krep); 
        maxdfs = xprune(krep); 

      } while (kpar != emptyIdxLU); // Do until empty stack 
      
    } // end if (myfnz = -1)

  } // end if (kperm == -1)   
}